

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp6.c
# Opt level: O0

void fp6_mul_sparse2(fp6_struct_st *rop,fp6_struct_st *op1,fp6_struct_st *op2,ATE_CTX *ctx)

{
  fp2_t tmp5;
  fp2_t tmp4;
  fp2_t tmp2;
  fp2_t tmp1;
  fp2_struct_st *in_stack_fffffffffffffed8;
  fp2_struct_st *in_stack_fffffffffffffee0;
  fp2_struct_st *in_stack_fffffffffffffee8;
  fp2_struct_st *in_stack_fffffffffffffef0;
  ATE_CTX *in_stack_ffffffffffffff38;
  fp2_struct_st *in_stack_ffffffffffffff40;
  fp2_struct_st *in_stack_ffffffffffffff48;
  fp2_struct_st *in_stack_ffffffffffffff50;
  
  fp2_mul(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
          in_stack_ffffffffffffff38);
  fp2_mul(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
          in_stack_ffffffffffffff38);
  fp2_add(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
          in_stack_fffffffffffffed8->m_a);
  fp2_add(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
          in_stack_fffffffffffffed8->m_a);
  fp2_mul(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
          in_stack_ffffffffffffff38);
  fp2_sub(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
          in_stack_fffffffffffffed8->m_a);
  fp2_sub(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
          in_stack_fffffffffffffed8->m_a);
  fp2_set(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  fp2_set(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  return;
}

Assistant:

void fp6_mul_sparse2(fp6_t rop, const fp6_t op1, const fp6_t op2, const ATE_CTX *ctx)
{
    fp2_t tmp1, tmp2, tmp4, tmp5; // Needed for intermediary values

    fp2_mul(tmp2, op1->m_b, op2->m_b, ctx);
    fp2_mul(tmp1, op1->m_c, op2->m_c, ctx);

    fp2_add(tmp4, op1->m_b, op1->m_c, ctx->p);
    fp2_add(tmp5, op2->m_b, op2->m_c, ctx->p);
    fp2_mul(rop->m_b, tmp4, tmp5, ctx);
    fp2_sub(rop->m_b, rop->m_b, tmp1, ctx->p);
    fp2_sub(rop->m_b, rop->m_b, tmp2, ctx->p);

    fp2_set(rop->m_a, tmp2);
    fp2_set(rop->m_c, tmp1);
}